

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O0

int32 read_tree_int(FILE *fp,char *name,int32 *out,int32 optional)

{
  int iVar1;
  char local_138 [4];
  int n;
  char line [256];
  int32 optional_local;
  int32 *out_local;
  char *name_local;
  FILE *fp_local;
  
  fp_local._4_4_ = __isoc99_fscanf(fp,"%255s %d",local_138,out);
  if (((optional == 0) && (fp_local._4_4_ != 2)) || (iVar1 = strcmp(local_138,name), iVar1 != 0)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kdtree.c"
            ,0x47,"%s not found: %d %s %d\n",name,(ulong)fp_local._4_4_,local_138,out);
    fp_local._4_4_ = 0xffffffff;
  }
  return fp_local._4_4_;
}

Assistant:

static int32
read_tree_int(FILE * fp, const char *name, int32 * out, int32 optional)
{
    char line[256];
    int n;

    n = fscanf(fp, "%255s %d", line, out);
    if ((optional == 0 && n != 2) || strcmp(line, name)) {
        E_ERROR("%s not found: %d %s %d\n", name, n, line, out);
        return -1;
    }
    return n;
}